

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jidctint.c
# Opt level: O3

void jpeg_idct_8x16(j_decompress_ptr cinfo,jpeg_component_info *compptr,JCOEFPTR coef_block,
                   JSAMPARRAY output_buf,JDIMENSION output_col)

{
  int iVar1;
  int iVar2;
  int iVar3;
  JSAMPLE *pJVar4;
  void *pvVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  int iVar24;
  long lVar25;
  int iVar26;
  long lVar27;
  long lVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  int iVar38;
  long lVar39;
  long lVar40;
  int workspace [128];
  int local_238 [130];
  
  pJVar4 = cinfo->sample_range_limit;
  pvVar5 = compptr->dct_table;
  lVar18 = 0;
  do {
    lVar9 = (long)*(int *)((long)pvVar5 + lVar18 * 4) * (long)coef_block[lVar18] * 0x2000;
    lVar12 = (long)*(int *)((long)pvVar5 + lVar18 * 4 + 0x80) * (long)coef_block[lVar18 + 0x20];
    lVar27 = lVar12 * 0x29cf + lVar9 + 0x400;
    lVar32 = lVar9 + 0x400 + lVar12 * -0x29cf;
    lVar35 = lVar12 * 0x1151 + lVar9 + 0x400;
    lVar39 = lVar9 + 0x400 + lVar12 * -0x1151;
    lVar9 = (long)*(int *)((long)pvVar5 + lVar18 * 4 + 0x40) * (long)coef_block[lVar18 + 0x10];
    lVar12 = (long)*(int *)((long)pvVar5 + lVar18 * 4 + 0xc0) * (long)coef_block[lVar18 + 0x30];
    lVar20 = (lVar9 - lVar12) * 0x8d4;
    lVar10 = (lVar9 - lVar12) * 0x2c63;
    lVar25 = lVar12 * 0x5203 + lVar10;
    lVar7 = lVar9 * 0x1ccd + lVar20;
    lVar10 = lVar9 * -0x133e + lVar10;
    lVar20 = lVar12 * -0x1050 + lVar20;
    lVar9 = lVar25 + lVar27;
    lVar27 = lVar27 - lVar25;
    lVar12 = lVar7 + lVar35;
    lVar35 = lVar35 - lVar7;
    lVar7 = lVar10 + lVar39;
    lVar39 = lVar39 - lVar10;
    lVar10 = lVar20 + lVar32;
    lVar32 = lVar32 - lVar20;
    lVar21 = (long)*(int *)((long)pvVar5 + lVar18 * 4 + 0x20) * (long)coef_block[lVar18 + 8];
    lVar20 = (long)*(int *)((long)pvVar5 + lVar18 * 4 + 0x60) * (long)coef_block[lVar18 + 0x18];
    lVar28 = (long)*(int *)((long)pvVar5 + lVar18 * 4 + 0xa0) * (long)coef_block[lVar18 + 0x28];
    lVar11 = (long)*(int *)((long)pvVar5 + lVar18 * 4 + 0xe0) * (long)coef_block[lVar18 + 0x38];
    lVar25 = (lVar20 + lVar21) * 0x2b4e;
    lVar16 = (lVar11 + lVar21) * 0x22fc;
    lVar33 = (lVar28 + lVar21) * 0x27e9;
    lVar40 = lVar21 * -0x492a + lVar25 + lVar33 + lVar16;
    lVar15 = (lVar21 - lVar11) * 0x1cb6;
    lVar34 = (lVar28 + lVar21) * 0x1555;
    lVar36 = (lVar21 - lVar20) * 0xd23;
    lVar17 = lVar21 * -0x3abe + lVar36 + lVar34 + lVar15;
    lVar22 = (lVar28 + lVar20) * 0x470;
    lVar21 = (lVar20 + lVar11) * -0x1555;
    lVar23 = lVar22 + lVar21 + lVar20 * 0x24d + lVar25;
    lVar37 = (lVar28 - lVar20) * 0x2d09;
    lVar25 = (lVar20 + lVar11) * -0x27e9;
    lVar36 = lVar37 + lVar25 + lVar20 * 0x3f1a + lVar36;
    lVar20 = (lVar11 + lVar28) * -0x2b4e;
    lVar22 = lVar33 + lVar20 + lVar28 * -0x2406 + lVar22;
    lVar21 = lVar16 + lVar20 + lVar11 * 0x2218 + lVar21;
    lVar20 = (lVar11 - lVar28) * 0xd23;
    lVar25 = lVar15 + lVar20 + lVar11 * 0x6485 + lVar25;
    lVar20 = lVar34 + lVar20 + lVar28 * -0x1886 + lVar37;
    local_238[lVar18] = (int)((ulong)(lVar40 + lVar9) >> 0xb);
    local_238[lVar18 + 0x78] = (int)((ulong)(lVar9 - lVar40) >> 0xb);
    local_238[lVar18 + 8] = (int)((ulong)(lVar23 + lVar12) >> 0xb);
    local_238[lVar18 + 0x70] = (int)((ulong)(lVar12 - lVar23) >> 0xb);
    local_238[lVar18 + 0x10] = (int)((ulong)(lVar22 + lVar7) >> 0xb);
    local_238[lVar18 + 0x68] = (int)((ulong)(lVar7 - lVar22) >> 0xb);
    local_238[lVar18 + 0x18] = (int)((ulong)(lVar21 + lVar10) >> 0xb);
    local_238[lVar18 + 0x60] = (int)((ulong)(lVar10 - lVar21) >> 0xb);
    local_238[lVar18 + 0x20] = (int)((ulong)(lVar32 + lVar25) >> 0xb);
    local_238[lVar18 + 0x58] = (int)((ulong)(lVar32 - lVar25) >> 0xb);
    local_238[lVar18 + 0x28] = (int)((ulong)(lVar39 + lVar20) >> 0xb);
    local_238[lVar18 + 0x50] = (int)((ulong)(lVar39 - lVar20) >> 0xb);
    local_238[lVar18 + 0x30] = (int)((ulong)(lVar36 + lVar35) >> 0xb);
    local_238[lVar18 + 0x48] = (int)((ulong)(lVar35 - lVar36) >> 0xb);
    local_238[lVar18 + 0x38] = (int)((ulong)(lVar17 + lVar27) >> 0xb);
    local_238[lVar18 + 0x40] = (int)((ulong)(lVar27 - lVar17) >> 0xb);
    lVar18 = lVar18 + 1;
  } while ((int)lVar18 != 8);
  uVar13 = (ulong)output_col;
  lVar18 = 0;
  do {
    iVar6 = (local_238[lVar18 + 6] + local_238[lVar18 + 2]) * 0x1151;
    iVar8 = local_238[lVar18 + 1];
    iVar26 = local_238[lVar18 + 2] * 0x187e + iVar6;
    iVar19 = (local_238[lVar18] + local_238[lVar18 + 4] + 0x10) * 0x2000;
    iVar6 = local_238[lVar18 + 6] * -0x3b21 + iVar6;
    iVar24 = ((local_238[lVar18] + 0x10) - local_238[lVar18 + 4]) * 0x2000;
    iVar1 = iVar19 + iVar26;
    iVar19 = iVar19 - iVar26;
    iVar26 = iVar24 + iVar6;
    iVar2 = local_238[lVar18 + 7];
    iVar3 = local_238[lVar18 + 5];
    iVar24 = iVar24 - iVar6;
    iVar6 = local_238[lVar18 + 3];
    iVar14 = (iVar8 + iVar2) * -0x1ccd;
    iVar29 = (iVar6 + iVar2 + iVar8 + iVar3) * 0x25a1;
    iVar31 = (iVar8 + iVar3) * -0xc7c + iVar29;
    iVar38 = iVar8 * 0x300b + iVar14 + iVar31;
    iVar29 = (iVar6 + iVar2) * -0x3ec5 + iVar29;
    iVar30 = (iVar6 + iVar3) * -0x5203;
    iVar31 = iVar3 * 0x41b3 + iVar30 + iVar31;
    iVar8 = iVar2 * 0x98e + iVar14 + iVar29;
    iVar29 = iVar6 * 0x6254 + iVar30 + iVar29;
    lVar9 = *(long *)((long)output_buf + lVar18);
    *(JSAMPLE *)(lVar9 + uVar13) = pJVar4[(ulong)((uint)(iVar38 + iVar1) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar9 + 7 + uVar13) =
         pJVar4[(ulong)((uint)(iVar1 - iVar38) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar9 + 1 + uVar13) =
         pJVar4[(ulong)((uint)(iVar29 + iVar26) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar9 + 6 + uVar13) =
         pJVar4[(ulong)((uint)(iVar26 - iVar29) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar9 + 2 + uVar13) =
         pJVar4[(ulong)((uint)(iVar31 + iVar24) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar9 + 5 + uVar13) =
         pJVar4[(ulong)((uint)(iVar24 - iVar31) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar9 + 3 + uVar13) =
         pJVar4[(ulong)((uint)(iVar8 + iVar19) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar9 + 4 + uVar13) =
         pJVar4[(ulong)((uint)(iVar19 - iVar8) >> 0x12 & 0x3ff) + 0x80];
    lVar18 = lVar18 + 8;
  } while (lVar18 != 0x80);
  return;
}

Assistant:

GLOBAL(void)
jpeg_idct_8x16 (j_decompress_ptr cinfo, jpeg_component_info * compptr,
		JCOEFPTR coef_block,
		JSAMPARRAY output_buf, JDIMENSION output_col)
{
  INT32 tmp0, tmp1, tmp2, tmp3, tmp10, tmp11, tmp12, tmp13;
  INT32 tmp20, tmp21, tmp22, tmp23, tmp24, tmp25, tmp26, tmp27;
  INT32 z1, z2, z3, z4;
  JCOEFPTR inptr;
  ISLOW_MULT_TYPE * quantptr;
  int * wsptr;
  JSAMPROW outptr;
  JSAMPLE *range_limit = IDCT_range_limit(cinfo);
  int ctr;
  int workspace[8*16];	/* buffers data between passes */
  SHIFT_TEMPS

  /* Pass 1: process columns from input, store into work array.
   * 16-point IDCT kernel, cK represents sqrt(2) * cos(K*pi/32).
   */
  inptr = coef_block;
  quantptr = (ISLOW_MULT_TYPE *) compptr->dct_table;
  wsptr = workspace;
  for (ctr = 0; ctr < 8; ctr++, inptr++, quantptr++, wsptr++) {
    /* Even part */

    tmp0 = DEQUANTIZE(inptr[DCTSIZE*0], quantptr[DCTSIZE*0]);
    tmp0 <<= CONST_BITS;
    /* Add fudge factor here for final descale. */
    tmp0 += ONE << (CONST_BITS-PASS1_BITS-1);

    z1 = DEQUANTIZE(inptr[DCTSIZE*4], quantptr[DCTSIZE*4]);
    tmp1 = MULTIPLY(z1, FIX(1.306562965));      /* c4[16] = c2[8] */
    tmp2 = MULTIPLY(z1, FIX_0_541196100);       /* c12[16] = c6[8] */

    tmp10 = tmp0 + tmp1;
    tmp11 = tmp0 - tmp1;
    tmp12 = tmp0 + tmp2;
    tmp13 = tmp0 - tmp2;

    z1 = DEQUANTIZE(inptr[DCTSIZE*2], quantptr[DCTSIZE*2]);
    z2 = DEQUANTIZE(inptr[DCTSIZE*6], quantptr[DCTSIZE*6]);
    z3 = z1 - z2;
    z4 = MULTIPLY(z3, FIX(0.275899379));        /* c14[16] = c7[8] */
    z3 = MULTIPLY(z3, FIX(1.387039845));        /* c2[16] = c1[8] */

    tmp0 = z3 + MULTIPLY(z2, FIX_2_562915447);  /* (c6+c2)[16] = (c3+c1)[8] */
    tmp1 = z4 + MULTIPLY(z1, FIX_0_899976223);  /* (c6-c14)[16] = (c3-c7)[8] */
    tmp2 = z3 - MULTIPLY(z1, FIX(0.601344887)); /* (c2-c10)[16] = (c1-c5)[8] */
    tmp3 = z4 - MULTIPLY(z2, FIX(0.509795579)); /* (c10-c14)[16] = (c5-c7)[8] */

    tmp20 = tmp10 + tmp0;
    tmp27 = tmp10 - tmp0;
    tmp21 = tmp12 + tmp1;
    tmp26 = tmp12 - tmp1;
    tmp22 = tmp13 + tmp2;
    tmp25 = tmp13 - tmp2;
    tmp23 = tmp11 + tmp3;
    tmp24 = tmp11 - tmp3;

    /* Odd part */

    z1 = DEQUANTIZE(inptr[DCTSIZE*1], quantptr[DCTSIZE*1]);
    z2 = DEQUANTIZE(inptr[DCTSIZE*3], quantptr[DCTSIZE*3]);
    z3 = DEQUANTIZE(inptr[DCTSIZE*5], quantptr[DCTSIZE*5]);
    z4 = DEQUANTIZE(inptr[DCTSIZE*7], quantptr[DCTSIZE*7]);

    tmp11 = z1 + z3;

    tmp1  = MULTIPLY(z1 + z2, FIX(1.353318001));   /* c3 */
    tmp2  = MULTIPLY(tmp11,   FIX(1.247225013));   /* c5 */
    tmp3  = MULTIPLY(z1 + z4, FIX(1.093201867));   /* c7 */
    tmp10 = MULTIPLY(z1 - z4, FIX(0.897167586));   /* c9 */
    tmp11 = MULTIPLY(tmp11,   FIX(0.666655658));   /* c11 */
    tmp12 = MULTIPLY(z1 - z2, FIX(0.410524528));   /* c13 */
    tmp0  = tmp1 + tmp2 + tmp3 -
	    MULTIPLY(z1, FIX(2.286341144));        /* c7+c5+c3-c1 */
    tmp13 = tmp10 + tmp11 + tmp12 -
	    MULTIPLY(z1, FIX(1.835730603));        /* c9+c11+c13-c15 */
    z1    = MULTIPLY(z2 + z3, FIX(0.138617169));   /* c15 */
    tmp1  += z1 + MULTIPLY(z2, FIX(0.071888074));  /* c9+c11-c3-c15 */
    tmp2  += z1 - MULTIPLY(z3, FIX(1.125726048));  /* c5+c7+c15-c3 */
    z1    = MULTIPLY(z3 - z2, FIX(1.407403738));   /* c1 */
    tmp11 += z1 - MULTIPLY(z3, FIX(0.766367282));  /* c1+c11-c9-c13 */
    tmp12 += z1 + MULTIPLY(z2, FIX(1.971951411));  /* c1+c5+c13-c7 */
    z2    += z4;
    z1    = MULTIPLY(z2, - FIX(0.666655658));      /* -c11 */
    tmp1  += z1;
    tmp3  += z1 + MULTIPLY(z4, FIX(1.065388962));  /* c3+c11+c15-c7 */
    z2    = MULTIPLY(z2, - FIX(1.247225013));      /* -c5 */
    tmp10 += z2 + MULTIPLY(z4, FIX(3.141271809));  /* c1+c5+c9-c13 */
    tmp12 += z2;
    z2    = MULTIPLY(z3 + z4, - FIX(1.353318001)); /* -c3 */
    tmp2  += z2;
    tmp3  += z2;
    z2    = MULTIPLY(z4 - z3, FIX(0.410524528));   /* c13 */
    tmp10 += z2;
    tmp11 += z2;

    /* Final output stage */

    wsptr[8*0]  = (int) RIGHT_SHIFT(tmp20 + tmp0,  CONST_BITS-PASS1_BITS);
    wsptr[8*15] = (int) RIGHT_SHIFT(tmp20 - tmp0,  CONST_BITS-PASS1_BITS);
    wsptr[8*1]  = (int) RIGHT_SHIFT(tmp21 + tmp1,  CONST_BITS-PASS1_BITS);
    wsptr[8*14] = (int) RIGHT_SHIFT(tmp21 - tmp1,  CONST_BITS-PASS1_BITS);
    wsptr[8*2]  = (int) RIGHT_SHIFT(tmp22 + tmp2,  CONST_BITS-PASS1_BITS);
    wsptr[8*13] = (int) RIGHT_SHIFT(tmp22 - tmp2,  CONST_BITS-PASS1_BITS);
    wsptr[8*3]  = (int) RIGHT_SHIFT(tmp23 + tmp3,  CONST_BITS-PASS1_BITS);
    wsptr[8*12] = (int) RIGHT_SHIFT(tmp23 - tmp3,  CONST_BITS-PASS1_BITS);
    wsptr[8*4]  = (int) RIGHT_SHIFT(tmp24 + tmp10, CONST_BITS-PASS1_BITS);
    wsptr[8*11] = (int) RIGHT_SHIFT(tmp24 - tmp10, CONST_BITS-PASS1_BITS);
    wsptr[8*5]  = (int) RIGHT_SHIFT(tmp25 + tmp11, CONST_BITS-PASS1_BITS);
    wsptr[8*10] = (int) RIGHT_SHIFT(tmp25 - tmp11, CONST_BITS-PASS1_BITS);
    wsptr[8*6]  = (int) RIGHT_SHIFT(tmp26 + tmp12, CONST_BITS-PASS1_BITS);
    wsptr[8*9]  = (int) RIGHT_SHIFT(tmp26 - tmp12, CONST_BITS-PASS1_BITS);
    wsptr[8*7]  = (int) RIGHT_SHIFT(tmp27 + tmp13, CONST_BITS-PASS1_BITS);
    wsptr[8*8]  = (int) RIGHT_SHIFT(tmp27 - tmp13, CONST_BITS-PASS1_BITS);
  }
  
  /* Pass 2: process rows from work array, store into output array. */
  /* Note that we must descale the results by a factor of 8 == 2**3, */
  /* and also undo the PASS1_BITS scaling. */

  wsptr = workspace;
  for (ctr = 0; ctr < 16; ctr++) {
    outptr = output_buf[ctr] + output_col;
    
    /* Even part: reverse the even part of the forward DCT. */
    /* The rotator is sqrt(2)*c(-6). */
    
    z2 = (INT32) wsptr[2];
    z3 = (INT32) wsptr[6];
    
    z1 = MULTIPLY(z2 + z3, FIX_0_541196100);
    tmp2 = z1 + MULTIPLY(z2, FIX_0_765366865);
    tmp3 = z1 - MULTIPLY(z3, FIX_1_847759065);
    
    /* Add fudge factor here for final descale. */
    z2 = (INT32) wsptr[0] + (ONE << (PASS1_BITS+2));
    z3 = (INT32) wsptr[4];
    
    tmp0 = (z2 + z3) << CONST_BITS;
    tmp1 = (z2 - z3) << CONST_BITS;
    
    tmp10 = tmp0 + tmp2;
    tmp13 = tmp0 - tmp2;
    tmp11 = tmp1 + tmp3;
    tmp12 = tmp1 - tmp3;
    
    /* Odd part per figure 8; the matrix is unitary and hence its
     * transpose is its inverse.  i0..i3 are y7,y5,y3,y1 respectively.
     */
    
    tmp0 = (INT32) wsptr[7];
    tmp1 = (INT32) wsptr[5];
    tmp2 = (INT32) wsptr[3];
    tmp3 = (INT32) wsptr[1];
    
    z2 = tmp0 + tmp2;
    z3 = tmp1 + tmp3;

    z1 = MULTIPLY(z2 + z3, FIX_1_175875602); /* sqrt(2) * c3 */
    z2 = MULTIPLY(z2, - FIX_1_961570560); /* sqrt(2) * (-c3-c5) */
    z3 = MULTIPLY(z3, - FIX_0_390180644); /* sqrt(2) * (c5-c3) */
    z2 += z1;
    z3 += z1;

    z1 = MULTIPLY(tmp0 + tmp3, - FIX_0_899976223); /* sqrt(2) * (c7-c3) */
    tmp0 = MULTIPLY(tmp0, FIX_0_298631336); /* sqrt(2) * (-c1+c3+c5-c7) */
    tmp3 = MULTIPLY(tmp3, FIX_1_501321110); /* sqrt(2) * ( c1+c3-c5-c7) */
    tmp0 += z1 + z2;
    tmp3 += z1 + z3;

    z1 = MULTIPLY(tmp1 + tmp2, - FIX_2_562915447); /* sqrt(2) * (-c1-c3) */
    tmp1 = MULTIPLY(tmp1, FIX_2_053119869); /* sqrt(2) * ( c1+c3-c5+c7) */
    tmp2 = MULTIPLY(tmp2, FIX_3_072711026); /* sqrt(2) * ( c1+c3+c5-c7) */
    tmp1 += z1 + z3;
    tmp2 += z1 + z2;
    
    /* Final output stage: inputs are tmp10..tmp13, tmp0..tmp3 */
    
    outptr[0] = range_limit[(int) RIGHT_SHIFT(tmp10 + tmp3,
					      CONST_BITS+PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[7] = range_limit[(int) RIGHT_SHIFT(tmp10 - tmp3,
					      CONST_BITS+PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[1] = range_limit[(int) RIGHT_SHIFT(tmp11 + tmp2,
					      CONST_BITS+PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[6] = range_limit[(int) RIGHT_SHIFT(tmp11 - tmp2,
					      CONST_BITS+PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[2] = range_limit[(int) RIGHT_SHIFT(tmp12 + tmp1,
					      CONST_BITS+PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[5] = range_limit[(int) RIGHT_SHIFT(tmp12 - tmp1,
					      CONST_BITS+PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[3] = range_limit[(int) RIGHT_SHIFT(tmp13 + tmp0,
					      CONST_BITS+PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[4] = range_limit[(int) RIGHT_SHIFT(tmp13 - tmp0,
					      CONST_BITS+PASS1_BITS+3)
			    & RANGE_MASK];
    
    wsptr += DCTSIZE;		/* advance pointer to next row */
  }
}